

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_open(uv_udp_t *handle,uv_os_sock_t sock)

{
  undefined4 in_ESI;
  long in_RDI;
  int err;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x80) == -1) {
    local_4 = uv__set_reuse((int)in_RDI);
    if (local_4 == 0) {
      *(undefined4 *)(in_RDI + 0x80) = in_ESI;
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x72;
  }
  return local_4;
}

Assistant:

int uv_udp_open(uv_udp_t* handle, uv_os_sock_t sock) {
  int err;

  /* Check for already active socket. */
  if (handle->io_watcher.fd != -1)
    return -EALREADY;  /* FIXME(bnoordhuis) Should be -EBUSY. */

  err = uv__set_reuse(sock);
  if (err)
    return err;

  handle->io_watcher.fd = sock;
  return 0;
}